

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O0

void gud_values(int *n_data,double *x,double *fx)

{
  double local_f8;
  double x_vec [13];
  undefined8 local_88;
  double f_vec [13];
  double *fx_local;
  double *x_local;
  int *n_data_local;
  
  f_vec[0xc] = (double)fx;
  memcpy(&local_88,&DAT_00264580,0x68);
  memcpy(&local_f8,&DAT_002645f0,0x68);
  if (*n_data < 0) {
    *n_data = 0;
  }
  if (*n_data < 0xd) {
    *x = x_vec[(long)*n_data + -1];
    *(double *)f_vec[0xc] = f_vec[(long)*n_data + -1];
    *n_data = *n_data + 1;
  }
  else {
    *n_data = 0;
    *x = 0.0;
    *(undefined8 *)f_vec[0xc] = 0;
  }
  return;
}

Assistant:

void gud_values ( int *n_data, double *x, double *fx )

//****************************************************************************80
//
//  Purpose:
//
//    GUD_VALUES returns some values of the Gudermannian function.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    04 August 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Stephen Wolfram,
//    The Mathematica Book,
//    Fourth Edition,
//    Cambridge University Press, 1999,
//    ISBN: 0-521-64314-7,
//    LC: QA76.95.W65.
//
//    Daniel Zwillinger, editor,
//    CRC Standard Mathematical Tables and Formulae,
//    30th Edition,
//    CRC Press, 1996.
//
//  Parameters:
//
//    Input/output, int *N_DATA.
//    On input, if N_DATA is 0, the first test data is returned, and
//    N_DATA is set to the index of the test data.  On each subsequent
//    call, N_DATA is incremented and that test data is returned.  When
//    there is no more test data, N_DATA is set to 0.
//
//    Output, double *X, the argument of the function.
//
//    Output, double *FX, the value of the function.
//
{
# define N_MAX 13

  double f_vec[N_MAX] = {
    -1.301760336,  -0.8657694832, 0.0000000000, 
     0.09983374879, 0.1986798470, 0.4803810791, 
     0.8657694832,  1.131728345,  1.301760336,  
     1.406993569,   1.471304341,  1.510419908,  
     1.534169144 };
  double x_vec[N_MAX] = {
    -2.0, -1.0,  0.0, 
     0.1,  0.2,  0.5, 
     1.0,  1.5,  2.0, 
     2.5,  3.0,  3.5, 
     4.0};

  if ( *n_data < 0 )
  {
    *n_data = 0;
  }

  if ( N_MAX <= *n_data )
  {
    *n_data = 0;
    *x = 0.0;
    *fx = 0.0;
  }
  else
  {
    *x = x_vec[*n_data];
    *fx = f_vec[*n_data];
    *n_data = *n_data + 1;
  }

  return;
# undef N_MAX
}